

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Piece.h
# Opt level: O0

optional<libchess::Piece> libchess::Piece::from(char c)

{
  bool bVar1;
  int iVar2;
  char in_DIL;
  Color piece_color;
  optional<libchess::PieceType> piece_type;
  Color *in_stack_ffffffffffffffc8;
  _Optional_payload_base<libchess::Color> piece_color_00;
  _Optional_payload_base<libchess::PieceType> in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffec;
  _Optional_payload_base<libchess::Piece> local_8;
  
  PieceType::from((char)((ulong)in_stack_ffffffffffffffec >> 0x18));
  bVar1 = std::optional::operator_cast_to_bool((optional<libchess::PieceType> *)0x10c4a4);
  if (bVar1) {
    iVar2 = isupper((int)in_DIL);
    if (iVar2 == 0) {
      piece_color_00 = (_Optional_payload_base<libchess::Color>)&constants::BLACK;
    }
    else {
      piece_color_00 = (_Optional_payload_base<libchess::Color>)&constants::WHITE;
    }
    std::optional<libchess::PieceType>::operator*((optional<libchess::PieceType> *)0x10c4f4);
    std::optional<libchess::PieceType>::optional<libchess::PieceType_&,_true>
              ((optional<libchess::PieceType> *)piece_color_00,
               (PieceType *)in_stack_ffffffffffffffc8);
    std::optional<libchess::Color>::optional<libchess::Color_&,_true>
              ((optional<libchess::Color> *)piece_color_00,in_stack_ffffffffffffffc8);
    local_8 = (_Optional_payload_base<libchess::Piece>)
              from((optional<libchess::PieceType>)in_stack_ffffffffffffffd8,
                   (optional<libchess::Color>)piece_color_00);
  }
  else {
    std::optional<libchess::Piece>::optional((optional<libchess::Piece> *)0x10c4b2);
  }
  return (optional<libchess::Piece>)local_8;
}

Assistant:

constexpr static std::optional<Piece> from(char c) {
        auto piece_type = PieceType::from(c);
        if (!piece_type) {
            return {};
        }

        Color piece_color = std::isupper(c) ? constants::WHITE : constants::BLACK;
        return Piece::from(*piece_type, piece_color);
    }